

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ** __thiscall
google::protobuf::internal::GeneratedMessageReflection::DefaultRaw<std::__cxx11::string_const*>
          (GeneratedMessageReflection *this,FieldDescriptor *field)

{
  Message *pMVar1;
  int *piVar2;
  char *pcVar3;
  int in_EDX;
  
  pMVar1 = this->default_instance_;
  piVar2 = this->offsets_;
  pcVar3 = FieldDescriptor::index(field,(char *)field,in_EDX);
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
         ((long)&(pMVar1->super_MessageLite)._vptr_MessageLite + (long)piVar2[(int)pcVar3]);
}

Assistant:

inline const Type& GeneratedMessageReflection::DefaultRaw(
    const FieldDescriptor* field) const {
  const void* ptr = reinterpret_cast<const uint8*>(default_instance_) +
                    offsets_[field->index()];
  return *reinterpret_cast<const Type*>(ptr);
}